

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bit_vector.h
# Opt level: O3

void __thiscall bsim::dynamic_bit_vector::dynamic_bit_vector(dynamic_bit_vector *this,int N_)

{
  byte *pbVar1;
  int iVar2;
  pointer puVar3;
  uint uVar4;
  ulong uVar5;
  
  (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = N_ + 7;
  if (-1 < N_) {
    iVar2 = N_;
  }
  this->N = N_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->bits,(long)(int)(((iVar2 >> 3) - (uint)((N_ & 7U) == 0)) + 1));
  puVar3 = (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    uVar4 = 1;
    uVar5 = 0;
    do {
      puVar3[uVar5] = '\0';
      uVar5 = (ulong)uVar4;
      puVar3 = (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = uVar4 + 1;
    } while (uVar5 < (ulong)((long)(this->bits).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3));
  }
  if (0 < this->N) {
    uVar4 = 0;
    do {
      pbVar1 = (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start + (uVar4 >> 3);
      *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)uVar4 & 7));
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 < this->N);
  }
  return;
}

Assistant:

dynamic_bit_vector(const int N_) : N(N_) {
      bits.resize(NUM_BYTES(N));
      for (uint i = 0; i < bits.size(); i++) {
	bits[i] = 0;
      }
      
      for (int i = 0; i < N; i++) {
	set(i, 0);
      }
    }